

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool __thiscall ExpressionContext::IsGenericFunction(ExpressionContext *this,FunctionData *function)

{
  TypeBase *pTVar1;
  MatchData *pMVar2;
  bool bVar3;
  IntrusiveList<MatchData> *pIVar4;
  
  bVar3 = true;
  if (((function->type->super_TypeBase).isGeneric == false) &&
     ((pTVar1 = function->scope->ownerType, pTVar1 == (TypeBase *)0x0 ||
      (pTVar1->isGeneric == false)))) {
    pIVar4 = &function->generics;
    do {
      pMVar2 = pIVar4->head;
      bVar3 = pMVar2 != (MatchData *)0x0;
      if (pMVar2 == (MatchData *)0x0) {
        return bVar3;
      }
      pIVar4 = (IntrusiveList<MatchData> *)&pMVar2->next;
    } while (pMVar2->type->isGeneric != true);
  }
  return bVar3;
}

Assistant:

bool ExpressionContext::IsGenericFunction(FunctionData *function)
{
	if(function->type->isGeneric)
		return true;

	if(function->scope->ownerType && function->scope->ownerType->isGeneric)
		return true;

	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		if(curr->type->isGeneric)
			return true;
	}

	return false;
}